

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

int md5_compress(hash_state *md,uchar *buf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong32 i;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int local_98 [26];
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    local_98[lVar4] = *(int *)(buf + lVar4 * 4);
  }
  uVar1 = (md->sha1).state[1];
  uVar2 = (md->sha1).state[2];
  uVar3 = (md->sha1).state[3];
  uVar5 = ((uVar3 ^ uVar2) & uVar1 ^ uVar3) + local_98[0] + (md->sha1).state[0] + 0xd76aa478;
  uVar6 = (uVar5 * 0x80 | uVar5 >> 0x19) + uVar1;
  uVar5 = ((uVar2 ^ uVar1) & uVar6 ^ uVar2) + uVar3 + local_98[1] + 0xe8c7b756;
  uVar5 = (uVar5 * 0x1000 | uVar5 >> 0x14) + uVar6;
  uVar8 = ((uVar6 ^ uVar1) & uVar5 ^ uVar1) + uVar2 + local_98[2] + 0x242070db;
  uVar9 = (uVar8 * 0x20000 | uVar8 >> 0xf) + uVar5;
  uVar8 = ((uVar5 ^ uVar6) & uVar9 ^ uVar6) + uVar1 + local_98[3] + 0xc1bdceee;
  uVar8 = (uVar8 * 0x400000 | uVar8 >> 10) + uVar9;
  uVar6 = uVar6 + local_98[4] + ((uVar9 ^ uVar5) & uVar8 ^ uVar5) + 0xf57c0faf;
  uVar6 = (uVar6 * 0x80 | uVar6 >> 0x19) + uVar8;
  uVar5 = ((uVar8 ^ uVar9) & uVar6 ^ uVar9) + uVar5 + local_98[5] + 0x4787c62a;
  uVar7 = (uVar5 * 0x1000 | uVar5 >> 0x14) + uVar6;
  uVar5 = uVar9 + local_98[6] + ((uVar6 ^ uVar8) & uVar7 ^ uVar8) + 0xa8304613;
  uVar9 = (uVar5 * 0x20000 | uVar5 >> 0xf) + uVar7;
  uVar5 = ((uVar7 ^ uVar6) & uVar9 ^ uVar6) + uVar8 + local_98[7] + 0xfd469501;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar9;
  uVar6 = ((uVar9 ^ uVar7) & uVar5 ^ uVar7) + uVar6 + local_98[8] + 0x698098d8;
  uVar10 = (uVar6 * 0x80 | uVar6 >> 0x19) + uVar5;
  uVar6 = uVar7 + local_98[9] + ((uVar5 ^ uVar9) & uVar10 ^ uVar9) + 0x8b44f7af;
  uVar8 = (uVar6 * 0x1000 | uVar6 >> 0x14) + uVar10;
  uVar6 = (((uVar10 ^ uVar5) & uVar8 ^ uVar5) + uVar9 + local_98[10]) - 0xa44f;
  uVar6 = (uVar6 * 0x20000 | uVar6 >> 0xf) + uVar8;
  uVar5 = uVar5 + local_98[0xb] + ((uVar8 ^ uVar10) & uVar6 ^ uVar10) + 0x895cd7be;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar6;
  uVar7 = uVar10 + local_98[0xc] + ((uVar6 ^ uVar8) & uVar5 ^ uVar8) + 0x6b901122;
  uVar9 = (uVar7 * 0x80 | uVar7 >> 0x19) + uVar5;
  uVar8 = ((uVar5 ^ uVar6) & uVar9 ^ uVar6) + uVar8 + local_98[0xd] + 0xfd987193;
  uVar8 = (uVar8 * 0x1000 | uVar8 >> 0x14) + uVar9;
  uVar6 = ((uVar9 ^ uVar5) & uVar8 ^ uVar5) + uVar6 + local_98[0xe] + 0xa679438e;
  uVar7 = (uVar6 * 0x20000 | uVar6 >> 0xf) + uVar8;
  uVar5 = uVar5 + local_98[0xf] + ((uVar8 ^ uVar9) & uVar7 ^ uVar9) + 0x49b40821;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar7;
  uVar6 = ((uVar5 ^ uVar7) & uVar8 ^ uVar7) + uVar9 + local_98[1] + 0xf61e2562;
  uVar6 = (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar5;
  uVar8 = ((uVar6 ^ uVar5) & uVar7 ^ uVar5) + uVar8 + local_98[6] + 0xc040b340;
  uVar9 = (uVar8 * 0x200 | uVar8 >> 0x17) + uVar6;
  uVar8 = ((uVar9 ^ uVar6) & uVar5 ^ uVar6) + uVar7 + local_98[0xb] + 0x265e5a51;
  uVar8 = (uVar8 * 0x4000 | uVar8 >> 0x12) + uVar9;
  uVar5 = ((uVar8 ^ uVar9) & uVar6 ^ uVar9) + uVar5 + local_98[0] + 0xe9b6c7aa;
  uVar7 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar8;
  uVar5 = uVar6 + local_98[5] + ((uVar7 ^ uVar8) & uVar9 ^ uVar8) + 0xd62f105d;
  uVar5 = (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar7;
  uVar6 = uVar9 + local_98[10] + ((uVar5 ^ uVar7) & uVar8 ^ uVar7) + 0x2441453;
  uVar9 = (uVar6 * 0x200 | uVar6 >> 0x17) + uVar5;
  uVar6 = uVar8 + local_98[0xf] + ((uVar9 ^ uVar5) & uVar7 ^ uVar5) + 0xd8a1e681;
  uVar6 = (uVar6 * 0x4000 | uVar6 >> 0x12) + uVar9;
  uVar8 = uVar7 + local_98[4] + ((uVar6 ^ uVar9) & uVar5 ^ uVar9) + 0xe7d3fbc8;
  uVar7 = (uVar8 * 0x100000 | uVar8 >> 0xc) + uVar6;
  uVar5 = uVar5 + local_98[9] + ((uVar7 ^ uVar6) & uVar9 ^ uVar6) + 0x21e1cde6;
  uVar5 = (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar7;
  uVar8 = uVar9 + local_98[0xe] + ((uVar5 ^ uVar7) & uVar6 ^ uVar7) + 0xc33707d6;
  uVar9 = (uVar8 * 0x200 | uVar8 >> 0x17) + uVar5;
  uVar6 = uVar6 + local_98[3] + ((uVar9 ^ uVar5) & uVar7 ^ uVar5) + 0xf4d50d87;
  uVar8 = (uVar6 * 0x4000 | uVar6 >> 0x12) + uVar9;
  uVar6 = uVar7 + local_98[8] + ((uVar8 ^ uVar9) & uVar5 ^ uVar9) + 0x455a14ed;
  uVar7 = (uVar6 * 0x100000 | uVar6 >> 0xc) + uVar8;
  uVar5 = uVar5 + local_98[0xd] + ((uVar7 ^ uVar8) & uVar9 ^ uVar8) + 0xa9e3e905;
  uVar6 = (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar7;
  uVar5 = ((uVar6 ^ uVar7) & uVar8 ^ uVar7) + uVar9 + local_98[2] + 0xfcefa3f8;
  uVar5 = (uVar5 * 0x200 | uVar5 >> 0x17) + uVar6;
  uVar8 = uVar8 + local_98[7] + ((uVar5 ^ uVar6) & uVar7 ^ uVar6) + 0x676f02d9;
  uVar8 = (uVar8 * 0x4000 | uVar8 >> 0x12) + uVar5;
  uVar7 = uVar7 + local_98[0xc] + ((uVar8 ^ uVar5) & uVar6 ^ uVar5) + 0x8d2a4c8a;
  uVar7 = (uVar7 * 0x100000 | uVar7 >> 0xc) + uVar8;
  uVar6 = (uVar6 + local_98[5] + (uVar8 ^ uVar5 ^ uVar7)) - 0x5c6be;
  uVar6 = (uVar6 * 0x10 | uVar6 >> 0x1c) + uVar7;
  uVar5 = (uVar7 ^ uVar8 ^ uVar6) + uVar5 + local_98[8] + 0x8771f681;
  uVar9 = (uVar5 * 0x800 | uVar5 >> 0x15) + uVar6;
  uVar5 = uVar8 + local_98[0xb] + (uVar6 ^ uVar7 ^ uVar9) + 0x6d9d6122;
  uVar8 = (uVar5 * 0x10000 | uVar5 >> 0x10) + uVar9;
  uVar5 = uVar7 + local_98[0xe] + (uVar9 ^ uVar6 ^ uVar8) + 0xfde5380c;
  uVar7 = (uVar5 * 0x800000 | uVar5 >> 9) + uVar8;
  uVar5 = uVar6 + local_98[1] + (uVar8 ^ uVar9 ^ uVar7) + 0xa4beea44;
  uVar5 = (uVar5 * 0x10 | uVar5 >> 0x1c) + uVar7;
  uVar6 = uVar9 + local_98[4] + (uVar7 ^ uVar8 ^ uVar5) + 0x4bdecfa9;
  uVar9 = (uVar6 * 0x800 | uVar6 >> 0x15) + uVar5;
  uVar6 = uVar8 + local_98[7] + (uVar5 ^ uVar7 ^ uVar9) + 0xf6bb4b60;
  uVar6 = (uVar6 * 0x10000 | uVar6 >> 0x10) + uVar9;
  uVar8 = uVar7 + local_98[10] + (uVar9 ^ uVar5 ^ uVar6) + 0xbebfbc70;
  uVar8 = (uVar8 * 0x800000 | uVar8 >> 9) + uVar6;
  uVar5 = uVar5 + local_98[0xd] + (uVar6 ^ uVar9 ^ uVar8) + 0x289b7ec6;
  uVar5 = (uVar5 * 0x10 | uVar5 >> 0x1c) + uVar8;
  uVar7 = uVar9 + local_98[0] + (uVar8 ^ uVar6 ^ uVar5) + 0xeaa127fa;
  uVar9 = (uVar7 * 0x800 | uVar7 >> 0x15) + uVar5;
  uVar6 = uVar6 + local_98[3] + (uVar5 ^ uVar8 ^ uVar9) + 0xd4ef3085;
  uVar6 = (uVar6 * 0x10000 | uVar6 >> 0x10) + uVar9;
  uVar8 = uVar8 + local_98[6] + (uVar9 ^ uVar5 ^ uVar6) + 0x4881d05;
  uVar8 = (uVar8 * 0x800000 | uVar8 >> 9) + uVar6;
  uVar5 = uVar5 + local_98[9] + (uVar6 ^ uVar9 ^ uVar8) + 0xd9d4d039;
  uVar7 = (uVar5 * 0x10 | uVar5 >> 0x1c) + uVar8;
  uVar5 = (uVar8 ^ uVar6 ^ uVar7) + uVar9 + local_98[0xc] + 0xe6db99e5;
  uVar5 = (uVar5 * 0x800 | uVar5 >> 0x15) + uVar7;
  uVar6 = (uVar7 ^ uVar8 ^ uVar5) + uVar6 + local_98[0xf] + 0x1fa27cf8;
  uVar6 = (uVar6 * 0x10000 | uVar6 >> 0x10) + uVar5;
  uVar8 = (uVar5 ^ uVar7 ^ uVar6) + uVar8 + local_98[2] + 0xc4ac5665;
  uVar8 = (uVar8 * 0x800000 | uVar8 >> 9) + uVar6;
  uVar7 = ((~uVar5 | uVar8) ^ uVar6) + uVar7 + local_98[0] + 0xf4292244;
  uVar9 = (uVar7 * 0x40 | uVar7 >> 0x1a) + uVar8;
  uVar5 = ((~uVar6 | uVar9) ^ uVar8) + uVar5 + local_98[7] + 0x432aff97;
  uVar5 = (uVar5 * 0x400 | uVar5 >> 0x16) + uVar9;
  uVar6 = ((~uVar8 | uVar5) ^ uVar9) + uVar6 + local_98[0xe] + 0xab9423a7;
  uVar7 = (uVar6 * 0x8000 | uVar6 >> 0x11) + uVar5;
  uVar6 = ((~uVar9 | uVar7) ^ uVar5) + uVar8 + local_98[5] + 0xfc93a039;
  uVar8 = (uVar6 * 0x200000 | uVar6 >> 0xb) + uVar7;
  uVar6 = ((~uVar5 | uVar8) ^ uVar7) + uVar9 + local_98[0xc] + 0x655b59c3;
  uVar6 = (uVar6 * 0x40 | uVar6 >> 0x1a) + uVar8;
  uVar5 = uVar5 + local_98[3] + ((~uVar7 | uVar6) ^ uVar8) + 0x8f0ccc92;
  uVar5 = (uVar5 * 0x400 | uVar5 >> 0x16) + uVar6;
  uVar7 = (uVar7 + local_98[10] + ((~uVar8 | uVar5) ^ uVar6)) - 0x100b83;
  uVar7 = (uVar7 * 0x8000 | uVar7 >> 0x11) + uVar5;
  uVar8 = uVar8 + local_98[1] + ((~uVar6 | uVar7) ^ uVar5) + 0x85845dd1;
  uVar8 = (uVar8 * 0x200000 | uVar8 >> 0xb) + uVar7;
  uVar6 = uVar6 + local_98[8] + ((~uVar5 | uVar8) ^ uVar7) + 0x6fa87e4f;
  uVar6 = (uVar6 * 0x40 | uVar6 >> 0x1a) + uVar8;
  uVar5 = uVar5 + local_98[0xf] + ((~uVar7 | uVar6) ^ uVar8) + 0xfe2ce6e0;
  uVar5 = (uVar5 * 0x400 | uVar5 >> 0x16) + uVar6;
  uVar7 = uVar7 + local_98[6] + ((~uVar8 | uVar5) ^ uVar6) + 0xa3014314;
  uVar9 = (uVar7 * 0x8000 | uVar7 >> 0x11) + uVar5;
  uVar8 = uVar8 + local_98[0xd] + ((~uVar6 | uVar9) ^ uVar5) + 0x4e0811a1;
  uVar8 = (uVar8 * 0x200000 | uVar8 >> 0xb) + uVar9;
  uVar6 = uVar6 + local_98[4] + ((~uVar5 | uVar8) ^ uVar9) + 0xf7537e82;
  uVar7 = (uVar6 * 0x40 | uVar6 >> 0x1a) + uVar8;
  uVar5 = ((~uVar9 | uVar7) ^ uVar8) + uVar5 + local_98[0xb] + 0xbd3af235;
  uVar5 = (uVar5 * 0x400 | uVar5 >> 0x16) + uVar7;
  uVar6 = ((~uVar8 | uVar5) ^ uVar7) + uVar9 + local_98[2] + 0x2ad7d2bb;
  uVar6 = (uVar6 * 0x8000 | uVar6 >> 0x11) + uVar5;
  uVar8 = ((~uVar7 | uVar6) ^ uVar5) + uVar8 + local_98[9] + 0xeb86d391;
  (md->sha1).state[0] = uVar7 + (md->sha1).state[0];
  (md->sha1).state[1] = uVar1 + uVar6 + (uVar8 * 0x200000 | uVar8 >> 0xb);
  (md->sha1).state[2] = uVar6 + uVar2;
  (md->sha1).state[3] = uVar5 + uVar3;
  return uVar5 + uVar3;
}

Assistant:

static int  md5_compress(hash_state *md, unsigned char *buf)
#endif
{
    ulong32 i, W[16], a, b, c, d;
#ifdef LTC_SMALL_CODE
    ulong32 t;
#endif

    /* copy the state into 512-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD32L(W[i], buf + (4*i));
    }

    /* copy state */
    a = md->md5.state[0];
    b = md->md5.state[1];
    c = md->md5.state[2];
    d = md->md5.state[3];

#ifdef LTC_SMALL_CODE
    for (i = 0; i < 16; ++i) {
        FF(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 32; ++i) {
        GG(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 48; ++i) {
        HH(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 64; ++i) {
        II(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

#else
    FF(a,b,c,d,W[0],7,0xd76aa478UL)
    FF(d,a,b,c,W[1],12,0xe8c7b756UL)
    FF(c,d,a,b,W[2],17,0x242070dbUL)
    FF(b,c,d,a,W[3],22,0xc1bdceeeUL)
    FF(a,b,c,d,W[4],7,0xf57c0fafUL)
    FF(d,a,b,c,W[5],12,0x4787c62aUL)
    FF(c,d,a,b,W[6],17,0xa8304613UL)
    FF(b,c,d,a,W[7],22,0xfd469501UL)
    FF(a,b,c,d,W[8],7,0x698098d8UL)
    FF(d,a,b,c,W[9],12,0x8b44f7afUL)
    FF(c,d,a,b,W[10],17,0xffff5bb1UL)
    FF(b,c,d,a,W[11],22,0x895cd7beUL)
    FF(a,b,c,d,W[12],7,0x6b901122UL)
    FF(d,a,b,c,W[13],12,0xfd987193UL)
    FF(c,d,a,b,W[14],17,0xa679438eUL)
    FF(b,c,d,a,W[15],22,0x49b40821UL)
    GG(a,b,c,d,W[1],5,0xf61e2562UL)
    GG(d,a,b,c,W[6],9,0xc040b340UL)
    GG(c,d,a,b,W[11],14,0x265e5a51UL)
    GG(b,c,d,a,W[0],20,0xe9b6c7aaUL)
    GG(a,b,c,d,W[5],5,0xd62f105dUL)
    GG(d,a,b,c,W[10],9,0x02441453UL)
    GG(c,d,a,b,W[15],14,0xd8a1e681UL)
    GG(b,c,d,a,W[4],20,0xe7d3fbc8UL)
    GG(a,b,c,d,W[9],5,0x21e1cde6UL)
    GG(d,a,b,c,W[14],9,0xc33707d6UL)
    GG(c,d,a,b,W[3],14,0xf4d50d87UL)
    GG(b,c,d,a,W[8],20,0x455a14edUL)
    GG(a,b,c,d,W[13],5,0xa9e3e905UL)
    GG(d,a,b,c,W[2],9,0xfcefa3f8UL)
    GG(c,d,a,b,W[7],14,0x676f02d9UL)
    GG(b,c,d,a,W[12],20,0x8d2a4c8aUL)
    HH(a,b,c,d,W[5],4,0xfffa3942UL)
    HH(d,a,b,c,W[8],11,0x8771f681UL)
    HH(c,d,a,b,W[11],16,0x6d9d6122UL)
    HH(b,c,d,a,W[14],23,0xfde5380cUL)
    HH(a,b,c,d,W[1],4,0xa4beea44UL)
    HH(d,a,b,c,W[4],11,0x4bdecfa9UL)
    HH(c,d,a,b,W[7],16,0xf6bb4b60UL)
    HH(b,c,d,a,W[10],23,0xbebfbc70UL)
    HH(a,b,c,d,W[13],4,0x289b7ec6UL)
    HH(d,a,b,c,W[0],11,0xeaa127faUL)
    HH(c,d,a,b,W[3],16,0xd4ef3085UL)
    HH(b,c,d,a,W[6],23,0x04881d05UL)
    HH(a,b,c,d,W[9],4,0xd9d4d039UL)
    HH(d,a,b,c,W[12],11,0xe6db99e5UL)
    HH(c,d,a,b,W[15],16,0x1fa27cf8UL)
    HH(b,c,d,a,W[2],23,0xc4ac5665UL)
    II(a,b,c,d,W[0],6,0xf4292244UL)
    II(d,a,b,c,W[7],10,0x432aff97UL)
    II(c,d,a,b,W[14],15,0xab9423a7UL)
    II(b,c,d,a,W[5],21,0xfc93a039UL)
    II(a,b,c,d,W[12],6,0x655b59c3UL)
    II(d,a,b,c,W[3],10,0x8f0ccc92UL)
    II(c,d,a,b,W[10],15,0xffeff47dUL)
    II(b,c,d,a,W[1],21,0x85845dd1UL)
    II(a,b,c,d,W[8],6,0x6fa87e4fUL)
    II(d,a,b,c,W[15],10,0xfe2ce6e0UL)
    II(c,d,a,b,W[6],15,0xa3014314UL)
    II(b,c,d,a,W[13],21,0x4e0811a1UL)
    II(a,b,c,d,W[4],6,0xf7537e82UL)
    II(d,a,b,c,W[11],10,0xbd3af235UL)
    II(c,d,a,b,W[2],15,0x2ad7d2bbUL)
    II(b,c,d,a,W[9],21,0xeb86d391UL)
#endif

    md->md5.state[0] = md->md5.state[0] + a;
    md->md5.state[1] = md->md5.state[1] + b;
    md->md5.state[2] = md->md5.state[2] + c;
    md->md5.state[3] = md->md5.state[3] + d;

    return CRYPT_OK;
}